

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

bool __thiscall AggressiveBotStrategy::canAttack(AggressiveBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  Country *pCVar3;
  iterator iVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  bool bVar7;
  Country *pCVar8;
  Country *pCVar9;
  int local_74;
  AggressiveBotStrategy *local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_68;
  
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar7 = false;
  pCVar9 = (Country *)0x0;
  local_70 = this;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (bVar7) {
      pCVar3 = (local_70->super_PlayerStrategy).from;
      if (pCVar3 == (Country *)0x0) {
        bVar7 = true;
      }
      else {
        bVar7 = (bool)(*pCVar9->cyID == *pCVar3->cyID & bVar7);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_68);
      return bVar7;
    }
    pvVar1 = ((local_70->super_PlayerStrategy).player)->pOwnedCountries;
    ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar6 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                   _M_impl.super__Vector_impl_data._M_start; ppCVar6 != ppCVar2;
        ppCVar6 = ppCVar6 + 1) {
      pCVar3 = *ppCVar6;
      pCVar8 = pCVar3;
      if (pCVar9 != (Country *)0x0) {
        pCVar8 = pCVar9;
        if (*pCVar3->pNumberOfTroops <= *pCVar9->pNumberOfTroops) {
          local_74 = *pCVar9->cyID;
          iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::find(&local_68,&local_74);
          if ((_Rb_tree_header *)iVar4._M_node == &local_68._M_impl.super__Rb_tree_header)
          goto LAB_001099b5;
        }
        for (ppCVar5 = (pCVar3->pAdjCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            ppCVar5 !=
            (pCVar3->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish; ppCVar5 = ppCVar5 + 1) {
          if (*(*ppCVar5)->pPlayerOwnerId != *pCVar3->pPlayerOwnerId) {
            pCVar8 = pCVar3;
          }
        }
      }
LAB_001099b5:
      pCVar9 = pCVar8;
    }
    for (ppCVar6 = (pCVar9->pAdjCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar6 !=
        (pCVar9->pAdjCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
        ._M_impl.super__Vector_impl_data._M_finish; ppCVar6 = ppCVar6 + 1) {
      if (*(*ppCVar6)->pPlayerOwnerId != *pCVar9->pPlayerOwnerId) {
        bVar7 = true;
      }
    }
    if (bVar7 == false) {
      local_74 = *pCVar9->cyID;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_68,&local_74);
    }
  } while( true );
}

Assistant:

bool AggressiveBotStrategy::canAttack() {
    Map::Country* biggest = nullptr;
    bool canAttack = false;
    std::set<int> checkedCountries = std::set<int>();

    while(!canAttack) {
        for (auto* country : *player->getOwnedCountries()) {
            if (biggest == nullptr) {
                biggest = country;
            } else if (biggest->getNumberOfTroops() < country->getNumberOfTroops() ||
                       checkedCountries.find(biggest->getCountryId()) != checkedCountries.end()) {
                for (auto* neighbour : *country->getAdjCountries()) {
                    if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                        biggest = country;
                    }
                }
            }
        }

        for (auto* neighbour: *biggest->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() != biggest->getPlayerOwnerID()) {
                canAttack = true;
            }
        }
        if (!canAttack) {
            checkedCountries.insert(biggest->getCountryId());
        }
    }

    if (from != nullptr && biggest->getCountryId() != from->getCountryId()) {
        canAttack = false;
    }
    return canAttack;
}